

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

ostream * absl::lts_20250127::operator<<(ostream *os,int128 v)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int128 v_00;
  bool bVar4;
  ostream *poVar5;
  uint64_t in_RDX;
  char cVar6;
  anon_unknown_2 *in_RSI;
  fmtflags in_R8D;
  size_t count;
  long lVar7;
  uint128 uVar8;
  uint128 v_01;
  ulong uStackY_80;
  undefined8 uStack_78;
  string rep;
  string local_50;
  
  uVar8.hi_ = in_RDX;
  uVar8.lo_ = (uint64_t)in_RSI;
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  rep._M_dataplus._M_p = (pointer)&rep.field_2;
  rep._M_string_length = 0;
  rep.field_2._M_local_buf[0] = '\0';
  if ((uVar1 & 0x48) == 0) {
    if (((long)in_RDX < 0) || ((uVar1 >> 0xb & 1) != 0)) {
      std::__cxx11::string::assign((char *)&rep);
    }
    v_00.v_._8_8_ = rep._M_dataplus._M_p;
    v_00.v_._0_8_ = uStack_78;
    uVar8 = anon_unknown_2::UnsignedAbsoluteValue(in_RSI,v_00);
    bVar4 = true;
    uVar2 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  }
  else {
    bVar4 = false;
    uVar2 = uVar1;
  }
  v_01.lo_ = uVar8.hi_;
  v_01.hi_._0_4_ = uVar2;
  v_01.hi_._4_4_ = 0;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_
            (&local_50,(void *)uVar8.lo_,v_01,in_R8D);
  std::__cxx11::string::append((string *)&rep);
  std::__cxx11::string::~string((string *)&local_50);
  uVar3 = *(ulong *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  lVar7 = uVar3 - rep._M_string_length;
  if (uVar3 < rep._M_string_length || lVar7 == 0) goto LAB_00223e58;
  cVar6 = (char)lVar7;
  if (((byte)uVar1 & 0xb0) == 0x10) {
    if ((bVar4) && ((*rep._M_dataplus._M_p == '-' || (*rep._M_dataplus._M_p == '+')))) {
      std::ios::fill();
      uStackY_80 = 1;
    }
    else {
      if (((uVar1 & 0x24a) != 0x208) || (in_RSI == (anon_unknown_2 *)0x0 && in_RDX == 0))
      goto LAB_00223e3a;
      std::ios::fill();
      uStackY_80 = 2;
    }
  }
  else {
    if ((uVar1 & 0xb0) == 0x20) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)&rep,cVar6);
      goto LAB_00223e58;
    }
LAB_00223e3a:
    std::ios::fill();
    uStackY_80 = 0;
  }
  std::__cxx11::string::insert((ulong)&rep,uStackY_80,cVar6);
LAB_00223e58:
  poVar5 = std::operator<<(os,(string *)&rep);
  std::__cxx11::string::~string((string *)&rep);
  return poVar5;
}

Assistant:

std::ostream& operator<<(std::ostream& os, int128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep;

  // Add the sign if needed.
  bool print_as_decimal =
      (flags & std::ios::basefield) == std::ios::dec ||
      (flags & std::ios::basefield) == std::ios_base::fmtflags();
  if (print_as_decimal) {
    if (Int128High64(v) < 0) {
      rep = "-";
    } else if (flags & std::ios::showpos) {
      rep = "+";
    }
  }

  rep.append(Uint128ToFormattedString(
      print_as_decimal ? UnsignedAbsoluteValue(v) : uint128(v), os.flags()));

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    const size_t count = static_cast<size_t>(width) - rep.size();
    switch (flags & std::ios::adjustfield) {
      case std::ios::left:
        rep.append(count, os.fill());
        break;
      case std::ios::internal:
        if (print_as_decimal && (rep[0] == '+' || rep[0] == '-')) {
          rep.insert(size_t{1}, count, os.fill());
        } else if ((flags & std::ios::basefield) == std::ios::hex &&
                   (flags & std::ios::showbase) && v != 0) {
          rep.insert(size_t{2}, count, os.fill());
        } else {
          rep.insert(size_t{0}, count, os.fill());
        }
        break;
      default:  // std::ios::right
        rep.insert(size_t{0}, count, os.fill());
        break;
    }
  }

  return os << rep;
}